

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O3

Value jbcoin::STParsedJSONDetail::bad_type(string *object,string *field)

{
  long *plVar1;
  ValueHolder extraout_RAX;
  ValueHolder VVar2;
  string *in_RCX;
  long *plVar3;
  size_type *psVar4;
  string *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  Value VVar6;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  string local_38;
  undefined8 uVar5;
  
  make_name(&local_38,(STParsedJSONDetail *)field,in_RDX,in_RCX);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x27f310);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_68 = *plVar3;
    lStack_60 = plVar1[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar3;
    local_78 = (long *)*plVar1;
  }
  local_70 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_78);
  psVar4 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_58.field_2._M_allocated_capacity = *psVar4;
    local_58.field_2._8_8_ = plVar1[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar4;
    local_58._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_58._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  VVar6 = RPC::make_error((RPC *)object,rpcINVALID_PARAMS,&local_58);
  uVar5 = VVar6._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_RDX;
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
    uVar5 = extraout_RDX_00;
  }
  VVar2.string_ = (char *)&local_38.field_2;
  if (local_38._M_dataplus._M_p != VVar2.string_) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    VVar2 = extraout_RAX;
    uVar5 = extraout_RDX_01;
  }
  VVar6._8_8_ = uVar5;
  VVar6.value_.string_ = VVar2.string_;
  return VVar6;
}

Assistant:

static Json::Value bad_type (std::string const& object,
    std::string const& field)
{
    return RPC::make_error (rpcINVALID_PARAMS,
        "Field '" + make_name (object, field) + "' has bad type.");
}